

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O0

bool __thiscall helics::TimeCoordinator::addDependent(TimeCoordinator *this,GlobalFederateId fedID)

{
  bool bVar1;
  value_type *in_RDI;
  BaseTimeCoordinator *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  lock_handle<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
  *this_00;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
  *in_stack_ffffffffffffffc0;
  lock_handle<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
  local_30 [2];
  
  bVar1 = BaseTimeCoordinator::addDependent
                    (in_stack_ffffffffffffffa8,
                     (GlobalFederateId)(BaseType)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  if (bVar1) {
    this_00 = local_30;
    gmlc::libguarded::
    shared_guarded<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
    ::lock((shared_guarded<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
            *)in_stack_ffffffffffffffa8);
    gmlc::libguarded::
    lock_handle<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
    ::operator->(this_00);
    std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::push_back
              (in_stack_ffffffffffffffc0,in_RDI);
    gmlc::libguarded::
    lock_handle<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
    ::~lock_handle((lock_handle<std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>,_std::mutex>
                    *)0x63899c);
  }
  return bVar1;
}

Assistant:

bool TimeCoordinator::addDependent(GlobalFederateId fedID)
{
    if (BaseTimeCoordinator::addDependent(fedID)) {
        dependent_federates.lock()->push_back(fedID);
        return true;
    }
    return false;
}